

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O3

INCREMENT_TYPE __thiscall
duckdb::RangeInfoStruct<duckdb::TimestampRangeInfo,_false>::ListIncrementValue
          (RangeInfoStruct<duckdb::TimestampRangeInfo,_false> *this,idx_t row_idx)

{
  interval_t iVar1;
  INCREMENT_TYPE IVar2;
  INCREMENT_TYPE IVar3;
  undefined1 auVar4 [12];
  int64_t iVar5;
  
  if ((ulong)((*(long *)(this->args + 8) - *(long *)this->args >> 3) * 0x4ec4ec4ec4ec4ec5) < 3) {
    iVar1 = TimestampRangeInfo::DefaultIncrement();
    IVar2.months = iVar1.months;
    auVar4._4_4_ = iVar1.days;
    register0x00000010 = iVar1.micros;
    return IVar2;
  }
  if (**(long **)&this->field_0x98 != 0) {
    row_idx = (idx_t)*(uint *)(**(long **)&this->field_0x98 + row_idx * 4);
  }
  IVar3.micros = *(int64_t *)(*(long *)&this->field_0xa0 + 8 + row_idx * 0x10);
  IVar3._0_8_ = *(undefined8 *)(*(long *)&this->field_0xa0 + row_idx * 0x10);
  return IVar3;
}

Assistant:

typename OP::INCREMENT_TYPE ListIncrementValue(idx_t row_idx) {
		if (args.ColumnCount() < 3) {
			return OP::DefaultIncrement();
		} else {
			auto data = (typename OP::INCREMENT_TYPE *)vdata[2].data;
			auto idx = vdata[2].sel->get_index(row_idx);
			return data[idx];
		}
	}